

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::start_prediction_work(Solver *this)

{
  vector<float,_std::allocator<float>_> *in_RDI;
  uint uVar1;
  uint uVar2;
  Predictor pdc;
  bool in_stack_000001dd;
  bool in_stack_000001de;
  bool in_stack_000001df;
  string *in_stack_000001e0;
  Loss *in_stack_000001e8;
  Model *in_stack_000001f0;
  Reader *in_stack_000001f8;
  Predictor *in_stack_00000200;
  Predictor *in_stack_000003c0;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  vector<float,_std::allocator<float>_> *__x;
  vector<float,_std::allocator<float>_> local_98 [4];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Start to predict ...",&local_29);
  Color::print_action((string *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __x = local_98;
  Predictor::Predictor((Predictor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
             &in_RDI[0x18].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  uVar2 = *(byte *)((long)&in_RDI[0x14].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish + 5) & 1;
  uVar1 = *(byte *)((long)&in_RDI[0x15].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + 5) & 1;
  Predictor::Initialize
            (in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
             in_stack_000001e0,in_stack_000001df,in_stack_000001de,in_stack_000001dd);
  Predictor::Predict(in_stack_000003c0);
  Predictor::GetResult((Predictor *)CONCAT44(in_stack_ffffffffffffff2c,uVar1));
  std::vector<float,_std::allocator<float>_>::operator=(in_RDI,__x);
  std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
  Predictor::~Predictor((Predictor *)CONCAT44(in_stack_ffffffffffffff34,uVar2));
  return;
}

Assistant:

void Solver::start_prediction_work() {
  Color::print_action("Start to predict ...");
  Predictor pdc;
  pdc.Initialize(reader_[0],
                 model_,
                 loss_,
                 hyper_param_.output_file,
                 hyper_param_.sign,
                 hyper_param_.sigmoid,
                 hyper_param_.res_out);
  // Predict and write output
  pdc.Predict();
  this->out_ = pdc.GetResult();
}